

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExportDesc(WastParser *this,Export *export_)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  Result RVar2;
  TokenType TVar3;
  Enum EVar4;
  ExternalKind EVar5;
  Token local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  RVar2 = Expect(this,Lpar);
  EVar4 = Error;
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  EVar5 = First;
  TVar3 = Peek(this,0);
  if ((int)TVar3 < 0x1c) {
    if (TVar3 == Tag) {
      EVar5 = Last;
    }
    else {
      if (TVar3 != Global) {
LAB_0013b1a9:
        paVar1 = &local_88.loc.field_1;
        local_88.loc.filename._M_len = (size_t)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"an external kind","");
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   &local_88,&local_88.token_type_);
        RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_48,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_88.loc.filename._M_len == paVar1) {
          return (Result)RVar2.enum_;
        }
        operator_delete((void *)local_88.loc.filename._M_len,
                        (long)local_88.loc.field_1.field_1.offset + 1);
        return (Result)RVar2.enum_;
      }
      EVar5 = Global;
    }
  }
  else if (TVar3 == Memory) {
    EVar5 = Memory;
  }
  else if (TVar3 != First_RefKind) {
    if (TVar3 != Table) goto LAB_0013b1a9;
    EVar5 = Table;
  }
  export_->kind = EVar5;
  Consume(&local_88,this);
  RVar2 = ParseVar(this,&export_->var);
  if (RVar2.enum_ != Error) {
    RVar2 = Expect(this,Rpar);
    EVar4 = (Enum)(RVar2.enum_ == Error);
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseExportDesc(Export* export_) {
  WABT_TRACE(ParseExportDesc);
  EXPECT(Lpar);
  switch (Peek()) {
    case TokenType::Func:   export_->kind = ExternalKind::Func; break;
    case TokenType::Table:  export_->kind = ExternalKind::Table; break;
    case TokenType::Memory: export_->kind = ExternalKind::Memory; break;
    case TokenType::Global: export_->kind = ExternalKind::Global; break;
    case TokenType::Tag:    export_->kind = ExternalKind::Tag; break;
    default:
      return ErrorExpected({"an external kind"});
  }
  Consume();
  CHECK_RESULT(ParseVar(&export_->var));
  EXPECT(Rpar);
  return Result::Ok;
}